

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamToolsIndex::ReadBlock(BamToolsIndex *this,BtiBlock *block)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BamException *this_00;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,block,4);
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,&block->StartOffset,8);
  pIVar1 = (this->m_resources).Device;
  iVar4 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,&block->StartPosition,4);
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&block->MaxEndPosition);
    SwapEndian_64(&block->StartOffset);
    SwapEndian_32(&block->StartPosition);
  }
  if (CONCAT44(extraout_var_01,iVar4) +
      CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_50,"BamToolsIndex::ReadBlock",&local_71);
  std::__cxx11::string::string((string *)&local_70,"could not read block",&local_72);
  BamException::BamException(this_00,&local_50,&local_70);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::ReadBlock(BtiBlock& block)
{

    // read in block data members
    int64_t numBytesRead = 0;
    numBytesRead +=
        m_resources.Device->Read((char*)&block.MaxEndPosition, sizeof(block.MaxEndPosition));
    numBytesRead += m_resources.Device->Read((char*)&block.StartOffset, sizeof(block.StartOffset));
    numBytesRead +=
        m_resources.Device->Read((char*)&block.StartPosition, sizeof(block.StartPosition));

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_32(block.MaxEndPosition);
        SwapEndian_64(block.StartOffset);
        SwapEndian_32(block.StartPosition);
    }

    // check block read ok
    const int expectedBytes =
        sizeof(block.MaxEndPosition) + sizeof(block.StartOffset) + sizeof(block.StartPosition);
    if (numBytesRead != expectedBytes)
        throw BamException("BamToolsIndex::ReadBlock", "could not read block");
}